

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void canvas_howputnew(_glist *x,int *connectp,int *xpixp,int *ypixp,int *indexp,int *totalp)

{
  t_selection *ptVar1;
  int iVar2;
  t_gobj *ptVar3;
  t_gobj *ptVar4;
  int iVar5;
  _gobj *x_00;
  int iVar6;
  bool bVar7;
  bool bVar8;
  int x1;
  int y2;
  int y1;
  int x2;
  int local_5c;
  int *local_58;
  uint *local_50;
  int *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  ptVar1 = x->gl_editor->e_selection;
  if ((ptVar1 == (t_selection *)0x0) || (ptVar1->sel_next != (_selection *)0x0)) {
    bVar7 = false;
  }
  else {
    bVar7 = sys_noautopatch == 0;
  }
  iVar2 = x->gl_zoom;
  local_50 = (uint *)connectp;
  local_48 = indexp;
  glist_nograb(x);
  local_58 = totalp;
  if (bVar7 == false) {
    glist_getnextxy(x,xpixp,ypixp);
    *xpixp = *xpixp / x->gl_zoom + -3;
    *ypixp = *ypixp / x->gl_zoom + -3;
    glist_noselect(x);
    iVar6 = 0;
    iVar5 = 0;
  }
  else {
    ptVar3 = x->gl_list;
    iVar5 = 0;
    iVar6 = 0;
    if (ptVar3 != (t_gobj *)0x0) {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + 1;
        ptVar3 = ptVar3->g_next;
      } while (ptVar3 != (_gobj *)0x0);
    }
    ptVar3 = x->gl_editor->e_selection->sel_what;
    glist_noselect(x);
    x_00 = x->gl_list;
    bVar8 = x_00 == (t_gobj *)0x0;
    if ((!bVar8) && (x_00 != ptVar3)) {
      iVar5 = 0;
      ptVar4 = x_00;
      do {
        x_00 = ptVar4->g_next;
        if (x_00 == (_gobj *)0x0) {
          iVar5 = iVar6 + -1;
          x_00 = ptVar4;
          break;
        }
        iVar5 = iVar5 + 1;
        bVar8 = false;
        ptVar4 = x_00;
      } while (x_00 != ptVar3);
    }
    if (bVar8) {
      glist_getnextxy(x,xpixp,ypixp);
      *xpixp = *xpixp / x->gl_zoom + -3;
      iVar2 = *ypixp / x->gl_zoom + -3;
    }
    else {
      gobj_getrect(x_00,x,&local_5c,&local_38,&local_34,&local_3c);
      *xpixp = local_5c / x->gl_zoom;
      iVar2 = (int)(((float)local_3c + (float)iVar2 * 5.5) / (float)x->gl_zoom);
    }
    *ypixp = iVar2;
  }
  *local_50 = (uint)bVar7;
  *local_48 = iVar5;
  *local_58 = iVar6;
  return;
}

Assistant:

static void canvas_howputnew(t_canvas *x, int *connectp, int *xpixp, int *ypixp,
    int *indexp, int *totalp)
{
    float dx = 5.5 * x->gl_zoom;
    int xpix, ypix, indx = 0, nobj = 0, n2, x1, x2, y1, y2;
    int connectme = (x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next && !sys_noautopatch);
    glist_nograb(x);
    if (connectme)
    {
        t_gobj *g, *selected = x->gl_editor->e_selection->sel_what;
            /* get number of objects */
        for (g = x->gl_list, nobj = 0; g; g = g->g_next, nobj++) ;

            /* deselect the current selection (and create pending objects) */
        glist_noselect(x);

            /* search back for 'selected' and if it isn't on the list,
                plan just to connect from the last item on the list. */
        for (g = x->gl_list, n2 = 0; g; g = g->g_next, n2++)
        {
            if (g == selected)
            {
                indx = n2;
                break;
            }
            else if (!g->g_next) {
                    /* we couldn't find the selected object any more
                     * this probably means, that it was replaced by a newly
                     * created object, which is now the last on the list.
                     */
                indx = nobj-1;
                break;
            }
        }
            /* so where do we put the new object?
               just below the one we connect from! */
        if(g) {
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            *xpixp = x1 / x->gl_zoom;
            *ypixp = (y2+dx) / x->gl_zoom;  /* 5 pixels down, rounded */
        } else {
                /* just in case */
            glist_getnextxy(x, xpixp, ypixp);
            *xpixp = *xpixp/x->gl_zoom - 3;
            *ypixp = *ypixp/x->gl_zoom - 3;
        }
    }
    else
    {
        glist_getnextxy(x, xpixp, ypixp);
        *xpixp = *xpixp/x->gl_zoom - 3;
        *ypixp = *ypixp/x->gl_zoom - 3;
        glist_noselect(x);
    }
    *connectp = connectme;
    *indexp = indx;
    *totalp = nobj;
}